

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Intermediate.cpp
# Opt level: O0

bool __thiscall
glslang::TIntermediate::canImplicitlyPromote
          (TIntermediate *this,TBasicType from,TBasicType to,TOperator op)

{
  bool bVar1;
  EShSource EVar2;
  bool bVar3;
  bool local_61;
  bool local_59;
  bool local_4f;
  bool local_4d;
  bool toConvertable;
  bool fromConvertable;
  TOperator op_local;
  TBasicType to_local;
  TBasicType from_local;
  TIntermediate *this_local;
  
  bVar1 = isEsProfile(this);
  if (((bVar1) && (this->version < 0x136)) || (this->version == 0x6e)) {
    return false;
  }
  if (from == to) {
    return true;
  }
  EVar2 = getSource(this);
  if (EVar2 == EShSourceHlsl) {
    bVar1 = true;
    if (((from != EbtFloat) && (bVar1 = true, from != EbtDouble)) &&
       ((bVar1 = true, from != EbtInt && (bVar1 = true, from != EbtUint)))) {
      bVar1 = from == EbtBool;
    }
    bVar3 = true;
    if (((to != EbtFloat) && (bVar3 = true, to != EbtDouble)) &&
       ((bVar3 = true, to != EbtInt && (bVar3 = true, to != EbtUint)))) {
      bVar3 = to == EbtBool;
    }
    if (((bVar1) && (bVar3)) &&
       (((op == EOpFunctionCall ||
         ((((op == EOpLogicalNot || (op - EOpLogicalOr < 3)) || (op == EOpReturn)) ||
          ((op == EOpConstructStruct || (op - EOpAssign < 4)))))) ||
        ((op - EOpVectorTimesScalarAssign < 2 || (op - EOpDivAssign < 5)))))) {
      return true;
    }
  }
  EVar2 = getSource(this);
  if (EVar2 == EShSourceHlsl) {
    if ((from == EbtBool) && (((to == EbtInt || (to == EbtUint)) || (to == EbtFloat)))) {
      return true;
    }
  }
  else {
    bVar1 = isIntegralPromotion(this,from,to);
    if ((((bVar1) || (bVar1 = isFPPromotion(this,from,to), bVar1)) ||
        ((bVar1 = isIntegralConversion(this,from,to), bVar1 ||
         ((bVar1 = isFPConversion(this,from,to), bVar1 ||
          (bVar1 = isFPIntegralConversion(this,from,to), bVar1)))))) &&
       ((bVar1 = TNumericFeatures::contains(&this->numericFeatures,shader_explicit_arithmetic_types)
        , bVar1 ||
        (((((bVar1 = TNumericFeatures::contains
                               (&this->numericFeatures,shader_explicit_arithmetic_types_int8), bVar1
            || (bVar1 = TNumericFeatures::contains
                                  (&this->numericFeatures,shader_explicit_arithmetic_types_int16),
               bVar1)) ||
           (bVar1 = TNumericFeatures::contains
                              (&this->numericFeatures,shader_explicit_arithmetic_types_int32), bVar1
           )) || ((bVar1 = TNumericFeatures::contains
                                     (&this->numericFeatures,shader_explicit_arithmetic_types_int64)
                  , bVar1 ||
                  (bVar1 = TNumericFeatures::contains
                                     (&this->numericFeatures,
                                      shader_explicit_arithmetic_types_float16), bVar1)))) ||
         ((bVar1 = TNumericFeatures::contains
                             (&this->numericFeatures,shader_explicit_arithmetic_types_float32),
          bVar1 || (bVar1 = TNumericFeatures::contains
                                      (&this->numericFeatures,
                                       shader_explicit_arithmetic_types_float64), bVar1)))))))) {
      return true;
    }
  }
  bVar1 = isEsProfile(this);
  if (bVar1) {
    if (to == EbtFloat) {
      if (from != EbtInt && from != EbtUint) {
        return false;
      }
      bVar1 = TNumericFeatures::contains(&this->numericFeatures,shader_implicit_conversions);
      return bVar1;
    }
    if (to == EbtUint) {
      if (from != EbtInt) {
        return false;
      }
      bVar1 = TNumericFeatures::contains(&this->numericFeatures,shader_implicit_conversions);
      return bVar1;
    }
    return false;
  }
  switch(to) {
  case EbtFloat:
    switch(from) {
    case EbtFloat16:
      bVar1 = TNumericFeatures::contains(&this->numericFeatures,gpu_shader_half_float);
      local_59 = true;
      if (!bVar1) {
        EVar2 = getSource(this);
        local_59 = EVar2 == EShSourceHlsl;
      }
      this_local._7_1_ = local_59;
      break;
    default:
      this_local._7_1_ = false;
      break;
    case EbtInt16:
    case EbtUint16:
      this_local._7_1_ = TNumericFeatures::contains(&this->numericFeatures,gpu_shader_int16);
      break;
    case EbtInt:
    case EbtUint:
      this_local._7_1_ = true;
      break;
    case EbtBool:
      EVar2 = getSource(this);
      this_local._7_1_ = EVar2 == EShSourceHlsl;
    }
    break;
  case EbtDouble:
    if (from == EbtFloat) {
LAB_0073d1ac:
      local_4d = true;
      if (this->version < 400) {
        local_4d = TNumericFeatures::contains(&this->numericFeatures,gpu_shader_fp64);
      }
      return local_4d;
    }
    if (from != EbtFloat16) {
      if (from - EbtInt16 < 2) {
        if ((this->version < 400) &&
           (bVar1 = TNumericFeatures::contains(&this->numericFeatures,gpu_shader_fp64), !bVar1)) {
          return false;
        }
        bVar1 = TNumericFeatures::contains(&this->numericFeatures,gpu_shader_int16);
        return bVar1;
      }
      if (3 < from - EbtInt) {
        return false;
      }
      goto LAB_0073d1ac;
    }
    if (this->version < 400) {
      bVar1 = TNumericFeatures::contains(&this->numericFeatures,gpu_shader_fp64);
      local_4f = false;
      if (bVar1) goto LAB_0073d268;
    }
    else {
LAB_0073d268:
      local_4f = TNumericFeatures::contains(&this->numericFeatures,gpu_shader_half_float);
    }
    this_local._7_1_ = local_4f;
    break;
  case EbtFloat16:
    if (from == EbtInt16 || from == EbtUint16) {
      this_local._7_1_ = TNumericFeatures::contains(&this->numericFeatures,gpu_shader_int16);
    }
    else {
      this_local._7_1_ = false;
    }
    break;
  default:
    this_local._7_1_ = false;
    break;
  case EbtUint16:
    if (from == EbtInt16) {
      this_local._7_1_ = TNumericFeatures::contains(&this->numericFeatures,gpu_shader_int16);
    }
    else {
      this_local._7_1_ = false;
    }
    break;
  case EbtInt:
    if (from == EbtInt16) {
      this_local._7_1_ = TNumericFeatures::contains(&this->numericFeatures,gpu_shader_int16);
    }
    else if (from == EbtBool) {
      EVar2 = getSource(this);
      this_local._7_1_ = EVar2 == EShSourceHlsl;
    }
    else {
      this_local._7_1_ = false;
    }
    break;
  case EbtUint:
    if (from - EbtInt16 < 2) {
      this_local._7_1_ = TNumericFeatures::contains(&this->numericFeatures,gpu_shader_int16);
    }
    else if (from == EbtInt) {
      local_61 = true;
      if (this->version < 400) {
        EVar2 = getSource(this);
        local_61 = true;
        if (EVar2 != EShSourceHlsl) {
          local_61 = IsRequestedExtension(this,"GL_ARB_gpu_shader5");
        }
      }
      this_local._7_1_ = local_61;
    }
    else if (from == EbtBool) {
      EVar2 = getSource(this);
      this_local._7_1_ = EVar2 == EShSourceHlsl;
    }
    else {
      this_local._7_1_ = false;
    }
    break;
  case EbtInt64:
    if (from == EbtInt16) {
      this_local._7_1_ = TNumericFeatures::contains(&this->numericFeatures,gpu_shader_int16);
    }
    else if (from == EbtInt) {
      this_local._7_1_ = true;
    }
    else {
      this_local._7_1_ = false;
    }
    break;
  case EbtUint64:
    if (from - EbtInt16 < 2) {
      this_local._7_1_ = TNumericFeatures::contains(&this->numericFeatures,gpu_shader_int16);
    }
    else if (from - EbtInt < 3) {
      this_local._7_1_ = true;
    }
    else {
      this_local._7_1_ = false;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool TIntermediate::canImplicitlyPromote(TBasicType from, TBasicType to, TOperator op) const
{
    if ((isEsProfile() && version < 310 ) || version == 110)
        return false;

    if (from == to)
        return true;

    // TODO: Move more policies into language-specific handlers.
    // Some languages allow more general (or potentially, more specific) conversions under some conditions.
    if (getSource() == EShSourceHlsl) {
        const bool fromConvertable = (from == EbtFloat || from == EbtDouble || from == EbtInt || from == EbtUint || from == EbtBool);
        const bool toConvertable = (to == EbtFloat || to == EbtDouble || to == EbtInt || to == EbtUint || to == EbtBool);

        if (fromConvertable && toConvertable) {
            switch (op) {
            case EOpAndAssign:               // assignments can perform arbitrary conversions
            case EOpInclusiveOrAssign:       // ...
            case EOpExclusiveOrAssign:       // ...
            case EOpAssign:                  // ...
            case EOpAddAssign:               // ...
            case EOpSubAssign:               // ...
            case EOpMulAssign:               // ...
            case EOpVectorTimesScalarAssign: // ...
            case EOpMatrixTimesScalarAssign: // ...
            case EOpDivAssign:               // ...
            case EOpModAssign:               // ...
            case EOpReturn:                  // function returns can also perform arbitrary conversions
            case EOpFunctionCall:            // conversion of a calling parameter
            case EOpLogicalNot:
            case EOpLogicalAnd:
            case EOpLogicalOr:
            case EOpLogicalXor:
            case EOpConstructStruct:
                return true;
            default:
                break;
            }
        }
    }

    if (getSource() == EShSourceHlsl) {
        // HLSL
        if (from == EbtBool && (to == EbtInt || to == EbtUint || to == EbtFloat))
            return true;
    } else {
        // GLSL
        if (isIntegralPromotion(from, to) ||
            isFPPromotion(from, to) ||
            isIntegralConversion(from, to) ||
            isFPConversion(from, to) ||
            isFPIntegralConversion(from, to)) {

            if (numericFeatures.contains(TNumericFeatures::shader_explicit_arithmetic_types) ||
                numericFeatures.contains(TNumericFeatures::shader_explicit_arithmetic_types_int8) ||
                numericFeatures.contains(TNumericFeatures::shader_explicit_arithmetic_types_int16) ||
                numericFeatures.contains(TNumericFeatures::shader_explicit_arithmetic_types_int32) ||
                numericFeatures.contains(TNumericFeatures::shader_explicit_arithmetic_types_int64) ||
                numericFeatures.contains(TNumericFeatures::shader_explicit_arithmetic_types_float16) ||
                numericFeatures.contains(TNumericFeatures::shader_explicit_arithmetic_types_float32) ||
                numericFeatures.contains(TNumericFeatures::shader_explicit_arithmetic_types_float64)) {
                return true;
            }
        }
    }

    if (isEsProfile()) {
        switch (to) {
            case EbtFloat:
                switch (from) {
                case EbtInt:
                case EbtUint:
                    return numericFeatures.contains(TNumericFeatures::shader_implicit_conversions);
                default:
                    return false;
                }
            case EbtUint:
                switch (from) {
                case EbtInt:
                    return numericFeatures.contains(TNumericFeatures::shader_implicit_conversions);
                default:
                    return false;
                }
            default:
                return false;
        }        
    } else {
        switch (to) {
        case EbtDouble:
            switch (from) {
            case EbtInt:
            case EbtUint:
            case EbtInt64:
            case EbtUint64:
            case EbtFloat:
                return version >= 400 || numericFeatures.contains(TNumericFeatures::gpu_shader_fp64);
            case EbtInt16:
            case EbtUint16:
                return (version >= 400 || numericFeatures.contains(TNumericFeatures::gpu_shader_fp64)) &&
                                          numericFeatures.contains(TNumericFeatures::gpu_shader_int16);
            case EbtFloat16:
                return (version >= 400 || numericFeatures.contains(TNumericFeatures::gpu_shader_fp64)) &&
                                          numericFeatures.contains(TNumericFeatures::gpu_shader_half_float);
            default:
                return false;
           }
        case EbtFloat:
            switch (from) {
            case EbtInt:
            case EbtUint:
                 return true;
            case EbtBool:
                 return getSource() == EShSourceHlsl;
            case EbtInt16:
            case EbtUint16:
                return numericFeatures.contains(TNumericFeatures::gpu_shader_int16);
            case EbtFloat16:
                return numericFeatures.contains(TNumericFeatures::gpu_shader_half_float) ||
                    getSource() == EShSourceHlsl;
            default:
                 return false;
            }
        case EbtUint:
            switch (from) {
            case EbtInt:
                return version >= 400 || getSource() == EShSourceHlsl || IsRequestedExtension(E_GL_ARB_gpu_shader5);
            case EbtBool:
                return getSource() == EShSourceHlsl;
            case EbtInt16:
            case EbtUint16:
                return numericFeatures.contains(TNumericFeatures::gpu_shader_int16);
            default:
                return false;
            }
        case EbtInt:
            switch (from) {
            case EbtBool:
                return getSource() == EShSourceHlsl;
            case EbtInt16:
                return numericFeatures.contains(TNumericFeatures::gpu_shader_int16);
            default:
                return false;
            }
        case EbtUint64:
            switch (from) {
            case EbtInt:
            case EbtUint:
            case EbtInt64:
                return true;
            case EbtInt16:
            case EbtUint16:
                return numericFeatures.contains(TNumericFeatures::gpu_shader_int16);
            default:
                return false;
            }
        case EbtInt64:
            switch (from) {
            case EbtInt:
                return true;
            case EbtInt16:
                return numericFeatures.contains(TNumericFeatures::gpu_shader_int16);
            default:
                return false;
            }
        case EbtFloat16:
            switch (from) {
            case EbtInt16:
            case EbtUint16:
                return numericFeatures.contains(TNumericFeatures::gpu_shader_int16);
            default:
                break;
            }
            return false;
        case EbtUint16:
            switch (from) {
            case EbtInt16:
                return numericFeatures.contains(TNumericFeatures::gpu_shader_int16);
            default:
                break;
            }
            return false;
        default:
            return false;
        }
    }

    return false;
}